

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O2

void __thiscall ON_SerialNumberMap::ON_SerialNumberMap(ON_SerialNumberMap *this)

{
  ON_SN_BLOCK *__s;
  ON_SerialNumberMapPrivate *pOVar1;
  
  this->m_snblk_list_count = 0;
  this->m_snblk_list = (ON_SN_BLOCK **)0x0;
  this->m_sn_purged = 0;
  this->m_snblk_list_capacity = 0;
  this->m_private = (ON_SerialNumberMapPrivate *)0x0;
  this->m_sn_count = 0;
  this->m_e_blk = (ON_SN_BLOCK *)0x0;
  __s = (ON_SN_BLOCK *)operator_new(0x70020);
  memset(__s,0,0x70020);
  __s->m_sorted = 1;
  *(undefined4 *)((long)&__s->m_sn1 + 4) = 0;
  *(undefined8 *)&__s->m_reserved = 0;
  *(undefined8 *)((long)&__s->m_sn0 + 4) = 0;
  this->m_sn_block0 = __s;
  this->m_reserved1 = '\0';
  this->m_reserved2 = '\0';
  this->m_reserved3 = '\0';
  this->m_bHashTableIsValid = '\0';
  this->m_hash_block_count = 0;
  this->m_hash_capacity = 0;
  this->m_hash_table_blocks = (SN_ELEMENT ***)0x0;
  this->m_active_id_count = 0;
  (this->m_inactive_id).Data1 = 0;
  (this->m_inactive_id).Data2 = 0;
  (this->m_inactive_id).Data3 = 0;
  (this->m_inactive_id).Data4[0] = '\0';
  (this->m_inactive_id).Data4[1] = '\0';
  (this->m_inactive_id).Data4[2] = '\0';
  (this->m_inactive_id).Data4[3] = '\0';
  (this->m_inactive_id).Data4[4] = '\0';
  (this->m_inactive_id).Data4[5] = '\0';
  (this->m_inactive_id).Data4[6] = '\0';
  (this->m_inactive_id).Data4[7] = '\0';
  pOVar1 = (ON_SerialNumberMapPrivate *)operator_new(0x10);
  pOVar1->m_maxsn = 0;
  pOVar1->m_lower_maxsn = 0;
  this->m_private = pOVar1;
  return;
}

Assistant:

ON_SerialNumberMap::ON_SerialNumberMap()
  : m_sn_block0(*(new ON_SN_BLOCK()))
{
  m_private = new ON_SerialNumberMapPrivate();
}